

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_writer.cpp
# Opt level: O0

void ModelWriter::write_world_model(RandomizerWorld *world)

{
  RandomizerWorld *pRVar1;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  RandomizerWorld *local_10;
  RandomizerWorld *world_local;
  
  local_10 = world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"./json_data/item.json",&local_31);
  io::export_items_as_json(&world->super_World,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"./json_data/entity_type.json",&local_69);
  io::export_entity_types_as_json(&pRVar1->super_World,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"./json_data/map.json",&local_91);
  io::export_maps_as_json(&pRVar1->super_World,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"./json_data/map_connection.json",&local_b9);
  io::export_map_connections_as_json(&pRVar1->super_World,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"./json_data/map_palette.json",&local_e1);
  io::export_map_palettes_as_json(&pRVar1->super_World,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"./json_data/game_strings.json",&local_109);
  io::export_game_strings_as_json(&pRVar1->super_World,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  return;
}

Assistant:

void ModelWriter::write_world_model(const RandomizerWorld& world)
{
    io::export_items_as_json(world, "./json_data/item.json");
    io::export_entity_types_as_json(world, "./json_data/entity_type.json");
    io::export_maps_as_json(world, "./json_data/map.json");
    io::export_map_connections_as_json(world, "./json_data/map_connection.json");
    io::export_map_palettes_as_json(world, "./json_data/map_palette.json");
    io::export_game_strings_as_json(world, "./json_data/game_strings.json");
}